

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O3

bool_t botpOCRAStart(void *state,char *suite,octet *key,size_t key_len)

{
  char cVar1;
  byte bVar2;
  bool_t bVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  char *str;
  char *local_40;
  
  sVar4 = beltHMAC_keep();
  memSet(state,'\0',sVar4 * 2 + 0x340);
  bVar3 = strStartsWith(suite,"OCRA-1:HOTP-");
  if (bVar3 == 0) {
    return 0;
  }
  sVar4 = strLen("OCRA-1:HOTP-");
  pcVar10 = suite + sVar4;
  bVar3 = strStartsWith(pcVar10,"HBELT");
  if (bVar3 == 0) {
    return 0;
  }
  str = "HBELT";
  sVar4 = strLen("HBELT");
  if (pcVar10[sVar4] != '-') {
    return 0;
  }
  if ((byte)(pcVar10[sVar4 + 1] - 0x3aU) < 0xfa) {
    return 0;
  }
  *(ulong *)state = (ulong)(byte)(pcVar10[sVar4 + 1] - 0x30);
  if (pcVar10[sVar4 + 2] != ':') {
    return 0;
  }
  cVar1 = pcVar10[sVar4 + 3];
  if (cVar1 == 'C') {
    if (pcVar10[sVar4 + 4] != '-') {
      return 0;
    }
    *(undefined8 *)((long)state + 0x18) = 8;
    cVar1 = pcVar10[sVar4 + 5];
    lVar9 = sVar4 + 5;
  }
  else {
    lVar9 = sVar4 + 3;
  }
  pcVar10 = pcVar10 + lVar9;
  if (cVar1 != 'Q') {
    return 0;
  }
  uVar7 = (byte)pcVar10[1] - 0x41;
  if (0xd < uVar7) {
    return 0;
  }
  if ((0x2081U >> (uVar7 & 0x1f) & 1) == 0) {
    return 0;
  }
  *(char *)((long)state + 0xa0) = pcVar10[1];
  if ((byte)(pcVar10[2] - 0x3aU) < 0xf6) {
    return 0;
  }
  if ((byte)(pcVar10[3] - 0x3aU) < 0xf6) {
    return 0;
  }
  uVar5 = (ulong)(byte)(pcVar10[2] * '\n' + 0x20);
  *(ulong *)((long)state + 0xa8) = uVar5;
  cVar1 = pcVar10[3];
  *(ulong *)((long)state + 0xa8) = uVar5 + (long)cVar1 + -0x30;
  if ((uVar5 + (long)cVar1) - 0x71 < 0xffffffffffffffc3) {
    return 0;
  }
  local_40 = pcVar10 + 4;
  bVar3 = strStartsWith(local_40,"-P");
  if (bVar3 != 0) {
    pcVar10 = pcVar10 + 6;
    bVar3 = strStartsWith(pcVar10,"HBELT");
    uVar8 = 0x20;
    if (bVar3 == 0) {
      str = "SHA1";
      bVar3 = strStartsWith(pcVar10,"SHA1");
      uVar8 = 0x14;
      if (bVar3 == 0) {
        str = "SHA256";
        bVar3 = strStartsWith(pcVar10,"SHA256");
        uVar8 = 0x20;
        if (bVar3 == 0) {
          str = "SHA512";
          bVar3 = strStartsWith(pcVar10,"SHA512");
          uVar8 = 0x40;
          if (bVar3 == 0) {
            return 0;
          }
        }
      }
    }
    sVar4 = strLen(str);
    local_40 = pcVar10 + sVar4;
    *(undefined8 *)((long)state + 0xf0) = uVar8;
  }
  bVar3 = strStartsWith(local_40,"-S");
  if (bVar3 != 0) {
    if ((byte)(local_40[2] - 0x3aU) < 0xf6) {
      return 0;
    }
    if ((byte)(local_40[3] - 0x3aU) < 0xf6) {
      return 0;
    }
    if ((byte)(local_40[4] - 0x3aU) < 0xf6) {
      return 0;
    }
    uVar5 = (ulong)(byte)(local_40[2] * '\n' + 0x20);
    *(ulong *)((long)state + 0x2f8) = uVar5;
    lVar9 = (long)local_40[3] + uVar5;
    *(long *)((long)state + 0x2f8) = lVar9 * 10 + -0x1e0;
    uVar5 = ((long)local_40[4] + lVar9 * 10) - 0x210;
    *(ulong *)((long)state + 0x2f8) = uVar5;
    if (0x200 < uVar5) {
      return 0;
    }
    local_40 = local_40 + 5;
  }
  bVar3 = strStartsWith(local_40,"-T");
  if (bVar3 != 0) {
    if ((byte)(local_40[2] - 0x3aU) < 0xf7) {
      return 0;
    }
    bVar2 = local_40[2] - 0x30;
    uVar5 = (ulong)bVar2;
    *(ulong *)((long)state + 0x308) = uVar5;
    cVar1 = local_40[3];
    lVar9 = 3;
    if ((byte)(cVar1 - 0x30U) < 10) {
      lVar9 = (ulong)((uint)bVar2 * 2) * 5;
      *(long *)((long)state + 0x308) = lVar9;
      uVar5 = (lVar9 + local_40[3]) - 0x30;
      *(ulong *)((long)state + 0x308) = uVar5;
      cVar1 = local_40[4];
      lVar9 = 4;
    }
    local_40 = local_40 + lVar9 + 1;
    if (cVar1 == 'H') {
      lVar9 = 0xe10;
      if (0x30 < (long)uVar5) {
        return 0;
      }
    }
    else {
      if (cVar1 != 'M') {
        if (cVar1 != 'S') {
          return 0;
        }
        if (0x3b < (long)uVar5) {
          return 0;
        }
        goto LAB_0013ab50;
      }
      lVar9 = 0x3c;
      if (0x3b < (long)uVar5) {
        return 0;
      }
    }
    *(ulong *)((long)state + 0x308) = uVar5 * lVar9;
  }
LAB_0013ab50:
  cVar1 = *local_40;
  if (cVar1 == '\0') {
    sVar4 = beltHMAC_keep();
    beltHMACStart((void *)((long)state + sVar4 + 0x33a),key,key_len);
    sVar4 = strLen(suite);
    sVar6 = beltHMAC_keep();
    beltHMACStepA(suite,sVar4 + 1,(void *)((long)state + sVar6 + 0x33a));
  }
  return (uint)(cVar1 == '\0');
}

Assistant:

bool_t botpOCRAStart(void* state, const char* suite, const octet key[], 
	size_t key_len)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	const char* suite_save = suite;
	// pre
	ASSERT(strIsValid(suite));
	ASSERT(memIsDisjoint2(suite, strLen(suite) + 1, state, botpOCRA_keep()));
	ASSERT(memIsDisjoint2(key, key_len, state, botpOCRA_keep()));
	// подготовить state
	memSetZero(st, botpOCRA_keep());
	// разбор suite: префикс
	if (!strStartsWith(suite, ocra_prefix))
		return FALSE;
	suite += strLen(ocra_prefix);
	if (!strStartsWith(suite, ocra_hbelt))
		return FALSE;
	suite += strLen(ocra_hbelt);
	if (*suite++ != '-')
		return FALSE;
	// разбор suite: digit
	if (*suite < '4' || *suite > '9')
		return FALSE;
	st->digit = (size_t)(*suite++ - '0');
	// разбор suite: DataInput
	if (*suite++ != ':')
		return FALSE;
	// разбор suite: ctr
	if (*suite == 'C')
	{
		if (*++suite != '-')
			return FALSE;
		++suite;
		st->ctr_len = 8;
	}
	// разбор suite: q
	if (*suite++ != 'Q')
		return FALSE;
	switch (*suite)
	{
	case 'A':
	case 'N':
	case 'H':
		st->q_type = *suite++;
		break;
	default:
		return FALSE;
	}
	if (suite[0] < '0' || suite[0] > '9' || suite[1] < '0' || suite[1] > '9')
		return FALSE;
	st->q_max = (size_t)(suite[0] - '0');
	st->q_max *= 10, st->q_max += (size_t)(suite[1] - '0');
	if (st->q_max < 4 || st->q_max > 64)
		return FALSE;
	suite += 2;
	// разбор suite: p
	if (strStartsWith(suite, "-P"))
	{
		suite += 2;
		if (strStartsWith(suite, ocra_hbelt))
		{
			suite += strLen(ocra_hbelt);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha1))
		{
			suite += strLen(ocra_sha1);
			st->p_len = 20;
		}
		else if (strStartsWith(suite, ocra_sha256))
		{
			suite += strLen(ocra_sha256);
			st->p_len = 32;
		}
		else if (strStartsWith(suite, ocra_sha512))
		{
			suite += strLen(ocra_sha512);
			st->p_len = 64;
		}
		else
			return FALSE;
	}
	// разбор suite: s
	if (strStartsWith(suite, "-S"))
	{
		suite += 2;
		if (suite[0] < '0' || suite[0] > '9' || 
			suite[1] < '0' || suite[1] > '9' ||
			suite[2] < '0' || suite[2] > '9')
			return FALSE;
		st->s_len = (size_t)(suite[0] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[1] - '0');
		st->s_len *= 10, st->s_len += (size_t)(suite[2] - '0');
		if (st->s_len > 512)
			return FALSE;
		suite += 3;
	}
	// разбор suite: t
	if (strStartsWith(suite, "-T"))
	{
		suite += 2;
		if (*suite < '1' || *suite > '9')
			return FALSE;
		st->ts = (size_t)(*suite++ - '0');
		if (*suite >= '0' && *suite <= '9')
			st->ts *= 10, st->ts += (size_t)(*suite++ - '0');
		switch (*suite++)
		{
		case 'S':
			if (st->ts > 59)
				return FALSE;
			break;
		case 'M':
			if (st->ts > 59)
				return FALSE;
			st->ts *= 60;
			break;
		case 'H':
			if (st->ts > 48)
				return FALSE;
			st->ts *= 3600;
			break;
		default:
			return FALSE;
		}
	}
	// разбор suite: окончание
	if (*suite)
		return FALSE;
	// запуск HMAC 
	beltHMACStart(st->stack + beltHMAC_keep(), key, key_len);
	beltHMACStepA(suite_save, strLen(suite_save) + 1,
		st->stack + beltHMAC_keep());
	return TRUE;
}